

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trend.cpp
# Opt level: O0

RegressionModel Trend::fromString(string *value)

{
  char **ppcVar1;
  difference_type dVar2;
  undefined8 uVar3;
  char **find;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  KrigingException *in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffb8;
  char **in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  ppcVar1 = std::find<char_const*const*,std::__cxx11::string>
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffffb0);
  if (ppcVar1 != fromString::end) {
    dVar2 = std::distance<char_const*const*>
                      ((char **)in_stack_ffffffffffffffb0,(char **)in_stack_ffffffffffffffa8);
    return (RegressionModel)dVar2;
  }
  uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffffa0);
  uVar3 = __cxa_allocate_exception(0x28);
  std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::operator+(in_stack_ffffffffffffffa8,(char *)CONCAT44(in_stack_ffffffffffffffa4,uVar4));
  KrigingException::KrigingException(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  __cxa_throw(uVar3,&KrigingException::typeinfo,KrigingException::~KrigingException);
}

Assistant:

Trend::RegressionModel Trend::fromString(const std::string& value) {
  static auto begin = std::begin(Trend::enum_RegressionModel_strings);
  static auto end = std::end(Trend::enum_RegressionModel_strings);

  auto find = std::find(begin, end, value);
  if (find != end) {
    return static_cast<Trend::RegressionModel>(std::distance(begin, find));
  } else {
    // FIXME use std::optional as returned type
    throw KrigingException("Cannot convert '" + value + "' as a regression model");
  }
}